

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

vector<duckdb::PrimitiveType<double>,_true> *
duckdb::EquiWidthBinsDouble::Operation
          (vector<duckdb::PrimitiveType<double>,_true> *__return_storage_ptr__,Expression *expr,
          double min,double input_max,idx_t bin_count,bool nice_rounding)

{
  undefined1 auVar1 [16];
  bool bVar2;
  reference pvVar3;
  InvalidInputException *this;
  InternalException *this_00;
  double dVar4;
  double extraout_XMM0_Qb;
  double in_XMM1_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  allocator local_91;
  pointer local_90;
  pointer local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_60;
  double local_58;
  string local_40;
  
  local_88 = (pointer)input_max;
  dStack_80 = in_XMM1_Qb;
  local_58 = min;
  bVar2 = Value::IsFinite<double>(min);
  if ((!bVar2) || (bVar2 = Value::IsFinite<double>((double)local_88), !bVar2)) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,
               "equi_width_bucket does not support infinite or nan as min/max value",&local_91);
    InvalidInputException::InvalidInputException(this,&local_40);
    __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>).
  super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>).
  super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>).
  super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = (double)local_88 - local_58;
  dStack_70 = dStack_80;
  bVar2 = Value::IsFinite<double>(local_78);
  auVar6._8_4_ = (int)(bin_count >> 0x20);
  auVar6._0_8_ = bin_count;
  auVar6._12_4_ = 0x45300000;
  dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)bin_count) - 4503599627370496.0);
  if (bVar2) {
    local_78 = local_78 / dVar4;
  }
  else {
    auVar5._8_8_ = local_58;
    auVar5._0_8_ = local_88;
    auVar1._8_8_ = dVar4;
    auVar1._0_8_ = dVar4;
    auVar6 = divpd(auVar5,auVar1);
    dStack_70 = auVar6._8_8_;
    local_78 = auVar6._0_8_ - dStack_70;
  }
  local_90 = (pointer)GetPreviousPowerOfTen(local_78);
  if (nice_rounding) {
    local_78 = MakeNumberNice(local_78,local_78,ROUND);
    dStack_70 = extraout_XMM0_Qb;
    local_88 = (pointer)RoundToNumber((double)local_88,local_78,CEILING);
    bin_count = bin_count * 2;
  }
  if ((local_78 == 0.0) && (!NAN(local_78))) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_40,"step is 0!?",&local_91);
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_60 = 10.0 / (double)local_90;
  do {
    if ((double)local_88 <= local_58) {
      return __return_storage_ptr__;
    }
    local_90 = local_88;
    if (nice_rounding) {
      dVar4 = round(local_60 * (double)local_88);
      local_90 = (pointer)(dVar4 / local_60);
    }
    if ((__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ).
        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_01cf8929:
      if ((double)local_90 <= local_58) {
        return __return_storage_ptr__;
      }
      if (bin_count <=
          (ulong)((long)(__return_storage_ptr__->
                        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        ).
                        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        ).
                        super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        return __return_storage_ptr__;
      }
      local_40._M_dataplus._M_p = local_90;
      ::std::vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>::
      emplace_back<duckdb::PrimitiveType<double>>
                ((vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>
                  *)__return_storage_ptr__,(PrimitiveType<double> *)&local_40);
    }
    else {
      pvVar3 = vector<duckdb::PrimitiveType<double>,_true>::back(__return_storage_ptr__);
      if ((pvVar3->val != (double)local_90) || (NAN(pvVar3->val) || NAN((double)local_90)))
      goto LAB_01cf8929;
    }
    local_88 = (pointer)((double)local_88 - local_78);
  } while( true );
}

Assistant:

static vector<PrimitiveType<double>> Operation(const Expression &expr, double min, double input_max,
	                                               idx_t bin_count, bool nice_rounding) {
		double max = input_max;
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			throw InvalidInputException("equi_width_bucket does not support infinite or nan as min/max value");
		}
		vector<PrimitiveType<double>> result;
		const double span = max - min;
		double step;
		if (!Value::IsFinite(span)) {
			// max - min does not fit
			step = max / static_cast<double>(bin_count) - min / static_cast<double>(bin_count);
		} else {
			step = span / static_cast<double>(bin_count);
		}
		const double step_power_of_ten = GetPreviousPowerOfTen(step);
		if (nice_rounding) {
			// when doing nice rounding we try to make the max/step values nicer
			step = MakeNumberNice(step, step, NiceRounding::ROUND);
			max = RoundToNumber(input_max, step, NiceRounding::CEILING);
			// we allow for more bins when doing nice rounding since the bin count is approximate
			bin_count *= 2;
		}
		if (step == 0) {
			throw InternalException("step is 0!?");
		}

		const double round_multiplication = 10 / step_power_of_ten;
		for (double bin_boundary = max; bin_boundary > min; bin_boundary -= step) {
			// because floating point addition adds inaccuracies, we add rounding at every step
			double real_boundary = bin_boundary;
			if (nice_rounding) {
				real_boundary = std::round(bin_boundary * round_multiplication) / round_multiplication;
			}
			if (!result.empty() && result.back().val == real_boundary) {
				// skip this step
				continue;
			}
			if (real_boundary <= min || result.size() >= bin_count) {
				// we can never generate below input_min
				break;
			}
			result.push_back(real_boundary);
		}
		return result;
	}